

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::readNumber(OurReader *this,bool checkInf)

{
  char local_41;
  char local_3f;
  char local_3e;
  char local_3d;
  char local_3b;
  char local_3a;
  char local_29;
  char *pcStack_28;
  char c;
  Location p;
  bool checkInf_local;
  OurReader *this_local;
  
  pcStack_28 = this->current_;
  if (((checkInf) && (pcStack_28 != this->end_)) && (*pcStack_28 == 'I')) {
    this->current_ = pcStack_28 + 1;
    this_local._7_1_ = false;
  }
  else {
    local_29 = '0';
    while ('/' < local_29 && local_29 < ':') {
      this->current_ = pcStack_28;
      if (pcStack_28 < this->end_) {
        local_3a = *pcStack_28;
        pcStack_28 = pcStack_28 + 1;
      }
      else {
        local_3a = '\0';
      }
      local_29 = local_3a;
    }
    if (local_29 == '.') {
      this->current_ = pcStack_28;
      if (pcStack_28 < this->end_) {
        local_3b = *pcStack_28;
        pcStack_28 = pcStack_28 + 1;
      }
      else {
        local_3b = '\0';
      }
      local_29 = local_3b;
      while ('/' < local_29 && local_29 < ':') {
        this->current_ = pcStack_28;
        if (pcStack_28 < this->end_) {
          local_3d = *pcStack_28;
          pcStack_28 = pcStack_28 + 1;
        }
        else {
          local_3d = '\0';
        }
        local_29 = local_3d;
      }
    }
    if ((local_29 == 'e') || (local_29 == 'E')) {
      this->current_ = pcStack_28;
      if (pcStack_28 < this->end_) {
        local_3e = *pcStack_28;
        pcStack_28 = pcStack_28 + 1;
      }
      else {
        local_3e = '\0';
      }
      local_29 = local_3e;
      if ((local_3e == '+') || (local_3e == '-')) {
        this->current_ = pcStack_28;
        if (pcStack_28 < this->end_) {
          local_3f = *pcStack_28;
          pcStack_28 = pcStack_28 + 1;
        }
        else {
          local_3f = '\0';
        }
        local_29 = local_3f;
      }
      while ('/' < local_29 && local_29 < ':') {
        this->current_ = pcStack_28;
        if (pcStack_28 < this->end_) {
          local_41 = *pcStack_28;
          pcStack_28 = pcStack_28 + 1;
        }
        else {
          local_41 = '\0';
        }
        local_29 = local_41;
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool OurReader::readNumber(bool checkInf) {
  Location p = current_;
  if (checkInf && p != end_ && *p == 'I') {
    current_ = ++p;
    return false;
  }
  char c = '0'; // stopgap for already consumed character
  // integral part
  while (c >= '0' && c <= '9')
    c = (current_ = p) < end_ ? *p++ : '\0';
  // fractional part
  if (c == '.') {
    c = (current_ = p) < end_ ? *p++ : '\0';
    while (c >= '0' && c <= '9')
      c = (current_ = p) < end_ ? *p++ : '\0';
  }
  // exponential part
  if (c == 'e' || c == 'E') {
    c = (current_ = p) < end_ ? *p++ : '\0';
    if (c == '+' || c == '-')
      c = (current_ = p) < end_ ? *p++ : '\0';
    while (c >= '0' && c <= '9')
      c = (current_ = p) < end_ ? *p++ : '\0';
  }
  return true;
}